

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_test.cpp
# Opt level: O2

void juzzlin::StreamTest::testInfo_infoLoggingLevel_shouldPrintMessage
               (string *message,string *timestampSeparator)

{
  ostream *poVar1;
  SimpleLogger local_1a0 [8];
  stringstream ss;
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  juzzlin::SimpleLogger::setStream(Info,local_188);
  juzzlin::SimpleLogger::setLoggingLevel(Info);
  juzzlin::SimpleLogger::SimpleLogger(local_1a0);
  poVar1 = (ostream *)juzzlin::SimpleLogger::info_abi_cxx11_();
  std::operator<<(poVar1,(string *)message);
  juzzlin::SimpleLogger::~SimpleLogger(local_1a0);
  assertMessage(&ss,message,timestampSeparator);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void testInfo_infoLoggingLevel_shouldPrintMessage(const std::string & message, const std::string & timestampSeparator)
{
    std::stringstream ss;
    L::setStream(L::Level::Info, ss);
    L::setLoggingLevel(L::Level::Info);
    L().info() << message;
    assertMessage(ss, message, timestampSeparator);
}